

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<float>(CImg<unsigned_char> *this,float *min_val)

{
  byte bVar1;
  byte *pbVar2;
  CImgInstanceException *this_00;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte *pbVar7;
  char *pcVar8;
  
  pbVar2 = this->_data;
  if ((((pbVar2 != (byte *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    lVar3 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    bVar5 = *pbVar2;
    bVar6 = bVar5;
    if (0 < lVar3) {
      pbVar4 = pbVar2 + lVar3;
      pbVar7 = pbVar2;
      do {
        bVar1 = *pbVar7;
        if (bVar5 < bVar1) {
          pbVar2 = pbVar7;
          bVar5 = bVar1;
        }
        if (bVar1 < bVar6) {
          bVar6 = bVar1;
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 < pbVar4);
    }
    *min_val = (float)bVar6;
    return pbVar2;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  pcVar8 = "non-";
  if (this->_is_shared != false) {
    pcVar8 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar8,"unsigned char");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgException::~CImgException);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }